

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall mp::ArrayRef<int>::move_or_copy(ArrayRef<int> *this)

{
  size_type sVar1;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  ArrayRef<int> *in_stack_ffffffffffffffb0;
  allocator_type *in_stack_ffffffffffffffd8;
  int *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  vector<int,_std::allocator<int>_> *this_00;
  
  this_00 = in_RSI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (sVar1 == 0) {
    begin((ArrayRef<int> *)0x3d693b);
    end(in_stack_ffffffffffffffb0);
    std::allocator<int>::allocator((allocator<int> *)0x3d695d);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              (this_00,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8
              );
    std::allocator<int>::~allocator((allocator<int> *)0x3d6981);
  }
  else {
    in_RSI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    in_RSI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector
              (&in_stack_ffffffffffffffb0->save_,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

std::vector<T> move_or_copy() {
      if (save_.size()) {
        data_ = nullptr;
        size_ = 0;
        return std::move(save_);
      }
      return { begin(), end() };
    }